

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::Convolution3DLayerParams::Convolution3DLayerParams
          (Convolution3DLayerParams *this,Convolution3DLayerParams *from)

{
  int new_size;
  void *pvVar1;
  WeightParams *pWVar2;
  WeightParams *pWVar3;
  long lVar4;
  int32 *piVar5;
  int32 *piVar6;
  byte bVar7;
  
  bVar7 = 0;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__Convolution3DLayerParams_0040c948;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->outputshape_).current_size_ = 0;
  (this->outputshape_).total_size_ = 0;
  (this->outputshape_).rep_ = (Rep *)0x0;
  new_size = (from->outputshape_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&this->outputshape_,new_size);
    memcpy(((this->outputshape_).rep_)->elements,((from->outputshape_).rep_)->elements,
           (long)(from->outputshape_).current_size_ << 3);
    (this->outputshape_).current_size_ = (from->outputshape_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  pWVar2 = from->weights_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (Convolution3DLayerParams *)&_Convolution3DLayerParams_default_instance_) {
    pWVar3 = (WeightParams *)0x0;
  }
  else {
    pWVar3 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar3,pWVar2);
  }
  this->weights_ = pWVar3;
  pWVar2 = from->bias_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (Convolution3DLayerParams *)&_Convolution3DLayerParams_default_instance_) {
    pWVar3 = (WeightParams *)0x0;
  }
  else {
    pWVar3 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar3,pWVar2);
  }
  this->bias_ = pWVar3;
  piVar5 = &from->outputchannels_;
  piVar6 = &this->outputchannels_;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)piVar6 = *(undefined8 *)piVar5;
    piVar5 = piVar5 + (ulong)bVar7 * -4 + 2;
    piVar6 = piVar6 + (ulong)bVar7 * -4 + 2;
  }
  return;
}

Assistant:

Convolution3DLayerParams::Convolution3DLayerParams(const Convolution3DLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      outputshape_(from.outputshape_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_weights()) {
    weights_ = new ::CoreML::Specification::WeightParams(*from.weights_);
  } else {
    weights_ = NULL;
  }
  if (from.has_bias()) {
    bias_ = new ::CoreML::Specification::WeightParams(*from.bias_);
  } else {
    bias_ = NULL;
  }
  ::memcpy(&outputchannels_, &from.outputchannels_,
    reinterpret_cast<char*>(&custompaddingright_) -
    reinterpret_cast<char*>(&outputchannels_) + sizeof(custompaddingright_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Convolution3DLayerParams)
}